

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O1

vector<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
* __thiscall
AddrManImpl::GetEntries_
          (vector<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
           *__return_storage_ptr__,AddrManImpl *this,bool from_tried)

{
  mapped_type *other;
  ulong uVar1;
  int (*paiVar2) [64];
  undefined7 in_register_00000011;
  ulong uVar3;
  long lVar4;
  int (*paiVar5) [64];
  int (*paiVar6) [64];
  long in_FS_OFFSET;
  AddressPosition location;
  int id;
  AddrInfo info;
  AddressPosition local_cc;
  int local_bc;
  direct_or_indirect local_b8;
  uint local_a8;
  undefined8 local_a0;
  uint16_t local_98;
  rep local_90;
  ServiceFlags SStack_88;
  rep local_80;
  rep rStack_78;
  direct_or_indirect local_70;
  uint local_60;
  undefined8 local_58;
  rep local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paiVar5 = this->vvNew;
  uVar1 = 0x400;
  if ((int)CONCAT71(in_register_00000011,from_tried) != 0) {
    uVar1 = 0x100;
  }
  uVar3 = 0;
  do {
    lVar4 = 0;
    paiVar6 = paiVar5;
    do {
      local_bc = -1;
      if (from_tried) {
        if (uVar3 < 0x100) {
          paiVar2 = (int (*) [64])(this->vvTried[uVar3] + lVar4);
LAB_0085dec3:
          local_bc = (*paiVar2)[0];
        }
      }
      else {
        paiVar2 = paiVar6;
        if (uVar3 < 0x400) goto LAB_0085dec3;
      }
      if (-1 < local_bc) {
        other = std::__detail::
                _Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)&this->mapInfo,&local_bc);
        prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_b8.indirect_contents,
                   (prevector<16U,_unsigned_char,_unsigned_int,_int> *)other);
        local_a0._0_4_ = (other->super_CAddress).super_CService.super_CNetAddr.m_net;
        local_a0._4_4_ = (other->super_CAddress).super_CService.super_CNetAddr.m_scope_id;
        local_98 = (other->super_CAddress).super_CService.port;
        local_90 = (other->super_CAddress).nTime.__d.__r;
        SStack_88 = (other->super_CAddress).nServices;
        local_80 = (other->m_last_try).__d.__r;
        rStack_78 = (other->m_last_count_attempt).__d.__r;
        prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_70.indirect_contents,
                   &(other->source).m_addr);
        local_58._0_4_ = (other->source).m_net;
        local_58._4_4_ = (other->source).m_scope_id;
        local_40._0_1_ = other->fInTried;
        local_40._1_3_ = *(undefined3 *)&other->field_0x79;
        local_40._4_4_ = other->nRandomPos;
        local_50 = (other->m_last_success).__d.__r;
        uStack_48._0_4_ = other->nAttempts;
        uStack_48._4_4_ = other->nRefCount;
        local_cc.multiplicity = 1;
        if (!from_tried) {
          local_cc.multiplicity = uStack_48._4_4_;
        }
        local_cc.bucket = (int)uVar3;
        local_cc.position = (int)lVar4;
        local_cc.tried = from_tried;
        std::
        vector<std::pair<AddrInfo,AddressPosition>,std::allocator<std::pair<AddrInfo,AddressPosition>>>
        ::emplace_back<AddrInfo&,AddressPosition&>
                  ((vector<std::pair<AddrInfo,AddressPosition>,std::allocator<std::pair<AddrInfo,AddressPosition>>>
                    *)__return_storage_ptr__,(AddrInfo *)&local_b8.indirect_contents,&local_cc);
        if (0x10 < local_60) {
          free(local_70.indirect_contents.indirect);
          local_70.indirect_contents.indirect = (char *)0x0;
        }
        if (0x10 < local_a8) {
          free(local_b8.indirect_contents.indirect);
          local_b8.indirect_contents.indirect = (char *)0x0;
        }
      }
      lVar4 = lVar4 + 1;
      paiVar6 = (int (*) [64])(*paiVar6 + 1);
    } while (lVar4 != 0x40);
    uVar3 = uVar3 + 1;
    paiVar5 = paiVar5 + 1;
    if (uVar3 == uVar1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

std::vector<std::pair<AddrInfo, AddressPosition>> AddrManImpl::GetEntries_(bool from_tried) const
{
    AssertLockHeld(cs);

    const int bucket_count = from_tried ? ADDRMAN_TRIED_BUCKET_COUNT : ADDRMAN_NEW_BUCKET_COUNT;
    std::vector<std::pair<AddrInfo, AddressPosition>> infos;
    for (int bucket = 0; bucket < bucket_count; ++bucket) {
        for (int position = 0; position < ADDRMAN_BUCKET_SIZE; ++position) {
            int id = GetEntry(from_tried, bucket, position);
            if (id >= 0) {
                AddrInfo info = mapInfo.at(id);
                AddressPosition location = AddressPosition(
                    from_tried,
                    /*multiplicity_in=*/from_tried ? 1 : info.nRefCount,
                    bucket,
                    position);
                infos.emplace_back(info, location);
            }
        }
    }

    return infos;
}